

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffrdef(fitsfile *fptr,int *status)

{
  int iVar1;
  fitsfile *in_RSI;
  int *in_RDI;
  char valstring [71];
  char comm [73];
  char card [81];
  LONGLONG pcount;
  LONGLONG naxis2;
  int tstatus;
  int dummy;
  char acStack_128 [4];
  int in_stack_fffffffffffffedc;
  fitsfile *in_stack_fffffffffffffee0;
  int *in_stack_ffffffffffffff18;
  char *in_stack_ffffffffffffff20;
  LONGLONG *in_stack_ffffffffffffff28;
  char *in_stack_ffffffffffffff30;
  fitsfile *in_stack_ffffffffffffff38;
  int *in_stack_ffffffffffffff40;
  int *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  fitsfile *in_stack_ffffffffffffff58;
  fitsfile *in_stack_ffffffffffffff60;
  int *in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  int *in_stack_ffffffffffffffd8;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffffe4;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  uVar2 = 0;
  if (in_RSI->HDUposition < 1) {
    if (*in_RDI == *(int *)(*(long *)(in_RDI + 2) + 0x54)) {
      if (*(int *)(*(long *)(in_RDI + 2) + 0x5c) == 1) {
        if (*(long *)(*(long *)(in_RDI + 2) + 0x88) != -1) {
          if (*(int *)(*(long *)(in_RDI + 2) + 0x58) != 0) {
            ffmaky(in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,(int *)0x168c7b);
            iVar1 = ffgkyjj(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                            in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                            in_stack_ffffffffffffff18);
            if (0 < iVar1) {
              in_stack_ffffffffffffffd8 = *(int **)(*(long *)(in_RDI + 2) + 0x3c0);
            }
            if (((long)in_stack_ffffffffffffffd8 < *(long *)(*(long *)(in_RDI + 2) + 0x3c0)) &&
               (*(int **)(*(long *)(in_RDI + 2) + 0x3b8) == in_stack_ffffffffffffffd8)) {
              snprintf(acStack_128,0x47,"%.0f",(double)*(long *)(*(long *)(in_RDI + 2) + 0x3c0));
              ffmkky((char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                     (char *)in_RDI,(char *)in_RSI,(char *)CONCAT44(in_stack_ffffffffffffffe4,uVar2)
                     ,in_stack_ffffffffffffffd8);
              ffmkey(in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58,
                     (int *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
            }
          }
          if (0 < *(long *)(*(long *)(in_RDI + 2) + 0x3e0)) {
            ffmaky(in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,(int *)0x168da4);
            ffgkyjj(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                    in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
            if (*(char **)(*(long *)(in_RDI + 2) + 0x3e0) != in_stack_ffffffffffffffd0) {
              ffmkyj(in_RSI,(char *)CONCAT44(in_stack_ffffffffffffffe4,uVar2),
                     (LONGLONG)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                     in_stack_ffffffffffffffc8);
            }
          }
        }
        iVar1 = ffwend((fitsfile *)valstring._24_8_,(int *)valstring._16_8_);
        if (iVar1 < 1) {
          ffrhdu((fitsfile *)card._8_8_,(int *)card._0_8_,stack0x00000098);
        }
      }
    }
    else {
      ffmahd(in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,in_stack_ffffffffffffff48,
             in_stack_ffffffffffffff40);
    }
    iVar1 = in_RSI->HDUposition;
  }
  else {
    iVar1 = in_RSI->HDUposition;
  }
  return iVar1;
}

Assistant:

int ffrdef(fitsfile *fptr,      /* I - FITS file pointer */
           int *status)         /* IO - error status     */
/*
  ReDEFine the structure of a data unit.  This routine re-reads
  the CHDU header keywords to determine the structure and length of the
  current data unit.  This redefines the start of the next HDU.
*/
{
    int dummy, tstatus = 0;
    LONGLONG naxis2;
    LONGLONG pcount;
    char card[FLEN_CARD], comm[FLEN_COMMENT], valstring[FLEN_VALUE];

    if (*status > 0)
        return(*status);

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
    {
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
    }
    else if ((fptr->Fptr)->writemode == 1) /* write access to the file? */
    {
        /* don't need to check NAXIS2 and PCOUNT if data hasn't been written */
        if ((fptr->Fptr)->datastart != DATA_UNDEFINED)
        {
          /* update NAXIS2 keyword if more rows were written to the table */
          /* and if the user has not explicitly reset the NAXIS2 value */
          if ((fptr->Fptr)->hdutype != IMAGE_HDU)
          {
            ffmaky(fptr, 2, status);
            if (ffgkyjj(fptr, "NAXIS2", &naxis2, comm, &tstatus) > 0)
            {
                /* Couldn't read NAXIS2 (odd!);  in certain circumstances */
                /* this may be normal, so ignore the error. */
                naxis2 = (fptr->Fptr)->numrows;
            }

            if ((fptr->Fptr)->numrows > naxis2
              && (fptr->Fptr)->origrows == naxis2)
              /* if origrows is not equal to naxis2, then the user must */
              /* have manually modified the NAXIS2 keyword value, and */
              /* we will assume that the current value is correct. */
            {
              /* would be simpler to just call ffmkyj here, but this */
              /* would force linking in all the modkey & putkey routines */

              /* print as double because the 64-bit int conversion */
              /* is platform dependent (%lld, %ld, %I64 )          */

              snprintf(valstring,FLEN_VALUE, "%.0f", (double) ((fptr->Fptr)->numrows));

              ffmkky("NAXIS2", valstring, comm, card, status);
              ffmkey(fptr, card, status);
            }
          }

          /* if data has been written to variable length columns in a  */
          /* binary table, then we may need to update the PCOUNT value */
          if ((fptr->Fptr)->heapsize > 0)
          {
            ffmaky(fptr, 2, status);
            ffgkyjj(fptr, "PCOUNT", &pcount, comm, status);
            if ((fptr->Fptr)->heapsize != pcount)
            {
              ffmkyj(fptr, "PCOUNT", (fptr->Fptr)->heapsize, comm, status);
            }
          }
        }

        if (ffwend(fptr, status) <= 0)     /* rewrite END keyword and fill */
        {
            ffrhdu(fptr, &dummy, status);  /* re-scan the header keywords  */
        }
    }
    return(*status);
}